

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftstream.c
# Opt level: O1

FT_UInt32 FT_Stream_ReadULong(FT_Stream stream,FT_Error *error)

{
  uint uVar1;
  unsigned_long uVar2;
  FT_UInt32 FVar3;
  uint *puVar4;
  FT_Error FVar5;
  FT_Byte reads [4];
  uint local_2c;
  
  uVar2 = stream->pos;
  FVar5 = 0x55;
  FVar3 = 0;
  if (uVar2 + 3 < stream->size) {
    if (stream->read == (FT_Stream_IoFunc)0x0) {
      puVar4 = (uint *)(stream->base + uVar2);
    }
    else {
      puVar4 = &local_2c;
      uVar2 = (*stream->read)(stream,uVar2,(uchar *)puVar4,4);
      FVar3 = 0;
      if (uVar2 != 4) goto LAB_0021bed5;
    }
    FVar5 = 0;
    FVar3 = 0;
    if (puVar4 != (uint *)0x0) {
      uVar1 = *puVar4;
      FVar3 = uVar1 >> 0x18 | (uVar1 & 0xff0000) >> 8 | (uVar1 & 0xff00) << 8 | uVar1 << 0x18;
    }
    stream->pos = stream->pos + 4;
  }
LAB_0021bed5:
  *error = FVar5;
  return FVar3;
}

Assistant:

FT_BASE_DEF( FT_UInt32 )
  FT_Stream_ReadULong( FT_Stream  stream,
                       FT_Error*  error )
  {
    FT_Byte   reads[4];
    FT_Byte*  p;
    FT_UInt32 result = 0;


    FT_ASSERT( stream );

    if ( stream->pos + 3 < stream->size )
    {
      if ( stream->read )
      {
        if ( stream->read( stream, stream->pos, reads, 4L ) != 4L )
          goto Fail;

        p = reads;
      }
      else
        p = stream->base + stream->pos;

      if ( p )
        result = FT_NEXT_ULONG( p );
    }
    else
      goto Fail;

    stream->pos += 4;

    *error = FT_Err_Ok;

    return result;

  Fail:
    *error = FT_THROW( Invalid_Stream_Operation );
    FT_ERROR(( "FT_Stream_ReadULong:"
               " invalid i/o; pos = 0x%lx, size = 0x%lx\n",
               stream->pos, stream->size ));

    return result;
  }